

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test.h
# Opt level: O2

void test_base<long,unsigned_int,bool(*)(long,unsigned_int,long*),long(*)(long,unsigned_int),0>
               (char *type_str,_func_bool_long_uint_long_ptr *fcn1,_func_long_long_uint *fcn2)

{
  bool bVar1;
  runtime_error *prVar2;
  TestCase<long,_unsigned_int,_0> TVar3;
  allocator local_d9;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long ret;
  string msg;
  TestVector<long,_unsigned_int,_0> tests;
  
  tests.test_cases = (TestCase<long,_unsigned_int,_0> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_d8 = type_str;
  TVar3 = TestVector<long,_unsigned_int,_0>::GetNext(&tests);
  while( true ) {
    if (tests.count <= tests.current) {
      return;
    }
    bVar1 = (*fcn1)(TVar3.x,TVar3.y,&ret);
    if (bVar1 != ((TVar3._8_8_ >> 0x20 & 1) != 0)) break;
    ret = (*fcn2)(TVar3.x,TVar3.y);
    if ((TVar3._12_4_ & 1) != 1) {
      std::__cxx11::string::string((string *)&local_d0,"Failure in ",&local_d9);
      std::operator+(&local_b0,&local_d0,"Mult");
      std::operator+(&local_90,&local_b0,"_test_");
      std::operator+(&msg,&local_90,local_d8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,msg._M_dataplus._M_p);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TVar3 = TestVector<long,_unsigned_int,_0>::GetNext(&tests);
  }
  std::__cxx11::string::string((string *)&local_d0,"Failure in ",&local_d9);
  std::operator+(&local_b0,&local_d0,"Mult");
  std::operator+(&local_90,&local_b0,"_test_");
  std::operator+(&msg,&local_90,local_d8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,msg._M_dataplus._M_p);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_base(const char* type_str, F1 fcn1, F2 fcn2)
{
	TestVector< T, U, op > tests;
	TestCase<T, U, op > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;

		// err_msg(std::string(OpName::op_name(op)) + "_test_" + type_str + " enter: ", test.x, test.y, test.fExpected);

		check_test<T, U> ct;
		bool result = ct.operator()(fcn1, test.x, test.y, &ret);

		if (!!result != test.fExpected)
		{
			std::string msg = std::string("Failure in ") + OpName::op_name(op) + "_test_" + type_str;
			// err_msg(msg, test.x, test.y, test.fExpected);
			throw std::runtime_error(msg.c_str());
		}

		bool actual;
		try
		{
			safe_test<T, U> st;
			ret = st.operator()(fcn2, test.x, test.y);
			actual = true;
		}
		catch (...)
		{
			actual = false;
		}

		if (actual != test.fExpected)
		{
			std::string msg = std::string("Failure in ") + OpName::op_name(op) + "_test_" + type_str;
			// err_msg(msg, test.x, test.y, test.fExpected);
			throw std::runtime_error(msg.c_str());
		}

		// err_msg(std::string(OpName::op_name(op)) + "_test_" + type_str + " completed: ", test.x, test.y, test.fExpected);
		test = tests.GetNext();
	}
}